

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O2

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (SampledValueFuncVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  pointer ppEVar1;
  bool bVar2;
  KnownSystemName KVar3;
  int *piVar4;
  Diagnostic *this_00;
  string_view arg;
  
  bVar2 = ClockInference::isSampledValueFuncCall((Expression *)expr);
  if (!bVar2) {
    ast::AssignmentPatternExpressionBase::visitExprs<slang::analysis::SampledValueFuncVisitor&>
              (&expr->super_AssignmentPatternExpressionBase,this);
    return;
  }
  KVar3 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  ppEVar1 = expr[1].super_AssignmentPatternExpressionBase.elements_._M_ptr;
  if (KVar3 == Past) {
    if (ppEVar1 != (pointer)0x4) goto LAB_00519d54;
    piVar4 = *(int **)((long)expr[1].super_AssignmentPatternExpressionBase.super_Expression.
                             sourceRange.endLoc + 0x18);
  }
  else {
    if (ppEVar1 != (pointer)0x2) goto LAB_00519d54;
    piVar4 = *(int **)((long)expr[1].super_AssignmentPatternExpressionBase.super_Expression.
                             sourceRange.endLoc + 8);
  }
  if (*piVar4 != 0x1e) {
    return;
  }
LAB_00519d54:
  this_00 = AnalysisContext::addDiag
                      (this->context,this->parentSymbol,(DiagCode)0x8000e,
                       (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
  arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }